

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall t_rb_generator::generate_enum(t_rb_generator *this,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *__x;
  reference pptVar5;
  string *psVar6;
  string local_198;
  string local_178;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_158;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_150;
  t_enum_value **local_148;
  string local_140;
  string local_120;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_100;
  int local_f4;
  iterator iStack_f0;
  int value_1;
  t_enum_value **local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  string name;
  iterator iStack_98;
  int value;
  t_enum_value **local_90;
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  local_88;
  iterator c_iter;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_58;
  string local_38;
  t_enum *local_18;
  t_enum *tenum_local;
  t_rb_generator *this_local;
  
  local_18 = tenum;
  tenum_local = (t_enum *)this;
  ptVar3 = t_rb_ofstream::indent(&this->f_types_);
  poVar4 = std::operator<<((ostream *)ptVar3,"module ");
  iVar2 = (*(local_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_58,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::capitalize(&local_38,(t_generator *)this,&local_58);
  poVar4 = std::operator<<(poVar4,(string *)&local_38);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  t_rb_ofstream::indent_up(&this->f_types_);
  __x = t_enum::get_constants(local_18);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
  ::__normal_iterator(&local_88);
  local_90 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_88._M_current = local_90;
  while( true ) {
    iStack_98 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                          ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_88,&stack0xffffffffffffff68);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    name.field_2._12_4_ = t_enum_value::get_value(*pptVar5);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    psVar6 = t_enum_value::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_e0,(string *)psVar6);
    t_generator::capitalize((string *)local_c0,(t_generator *)this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    generate_rdoc(this,&this->f_types_,&(*pptVar5)->super_t_doc);
    ptVar3 = t_rb_ofstream::indent(&this->f_types_);
    poVar4 = std::operator<<((ostream *)ptVar3,(string *)local_c0);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,name.field_2._12_4_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_c0);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_88);
  }
  ptVar3 = t_rb_ofstream::indent(&this->f_types_);
  std::operator<<((ostream *)ptVar3,"VALUE_MAP = {");
  local_e8 = (t_enum_value **)
             std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                       ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_88._M_current = local_e8;
  while( true ) {
    iStack_f0 = std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                          ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_88,&stack0xffffffffffffff10);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    local_f4 = t_enum_value::get_value(*pptVar5);
    local_100._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_100);
    if (bVar1) {
      std::operator<<((ostream *)&this->f_types_,", ");
    }
    poVar4 = (ostream *)std::ostream::operator<<(&this->f_types_,local_f4);
    poVar4 = std::operator<<(poVar4," => \"");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    psVar6 = t_enum_value::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_140,(string *)psVar6);
    t_generator::capitalize(&local_120,(t_generator *)this,&local_140);
    poVar4 = std::operator<<(poVar4,(string *)&local_120);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_88);
  }
  poVar4 = std::operator<<((ostream *)&this->f_types_,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(&this->f_types_);
  std::operator<<((ostream *)ptVar3,"VALID_VALUES = Set.new([");
  local_148 = (t_enum_value **)
              std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                        ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  local_88._M_current = local_148;
  while( true ) {
    local_150._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::end
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_150);
    if (!bVar1) break;
    local_158._M_current =
         (t_enum_value **)
         std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::begin
                   ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_158);
    if (bVar1) {
      std::operator<<((ostream *)&this->f_types_,", ");
    }
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
              ::operator*(&local_88);
    psVar6 = t_enum_value::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_198,(string *)psVar6);
    t_generator::capitalize(&local_178,(t_generator *)this,&local_198);
    std::operator<<((ostream *)&this->f_types_,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    __gnu_cxx::
    __normal_iterator<t_enum_value_**,_std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>_>
    ::operator++(&local_88);
  }
  poVar4 = std::operator<<((ostream *)&this->f_types_,"]).freeze");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_down(&this->f_types_);
  ptVar3 = t_rb_ofstream::indent(&this->f_types_);
  poVar4 = std::operator<<((ostream *)ptVar3,"end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&c_iter);
  return;
}

Assistant:

void t_rb_generator::generate_enum(t_enum* tenum) {
  f_types_.indent() << "module " << capitalize(tenum->get_name()) << endl;
  f_types_.indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();

    // Ruby class constants have to be capitalized... omg i am so on the fence
    // about languages strictly enforcing capitalization why can't we just all
    // agree and play nice.
    string name = capitalize((*c_iter)->get_name());

    generate_rdoc(f_types_, *c_iter);
    f_types_.indent() << name << " = " << value << endl;
  }

  // Create a hash mapping values back to their names (as strings) since ruby has no native enum
  // type
  f_types_.indent() << "VALUE_MAP = {";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the hash
    int value = (*c_iter)->get_value();
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << value << " => \"" << capitalize((*c_iter)->get_name()) << "\"";
  }
  f_types_ << "}" << endl;

  // Create a set with valid values for this enum
  f_types_.indent() << "VALID_VALUES = Set.new([";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the set
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << capitalize((*c_iter)->get_name());
  }
  f_types_ << "]).freeze" << endl;

  f_types_.indent_down();
  f_types_.indent() << "end" << endl << endl;
}